

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IT8951.c
# Opt level: O0

void LCDSendCmdArg(uint16_t usCmdCode,uint16_t *pArg,uint16_t usNumArg)

{
  ushort local_1c;
  uint16_t i;
  uint16_t usNumArg_local;
  uint16_t *pArg_local;
  uint16_t usCmdCode_local;
  
  LCDWriteCmdCode(usCmdCode);
  for (local_1c = 0; local_1c < usNumArg; local_1c = local_1c + 1) {
    LCDWriteData(pArg[local_1c]);
  }
  return;
}

Assistant:

void LCDSendCmdArg(uint16_t usCmdCode,uint16_t* pArg, uint16_t usNumArg)
{
     uint16_t i;
     //Send Cmd code
     LCDWriteCmdCode(usCmdCode);
     //Send Data
     for(i=0;i<usNumArg;i++)
     {
         LCDWriteData(pArg[i]);
     }
}